

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_avx2.c
# Opt level: O1

void iadst8x8_low1_avx2(__m256i *in,__m256i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  __m256i alVar2;
  __m256i alVar3;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  __m256i alVar6;
  __m256i alVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  undefined1 auVar11 [32];
  __m256i alVar12;
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  
  lVar10 = (long)bit * 0x100;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar10 + 0x170);
  auVar11._4_4_ = uVar1;
  auVar11._0_4_ = uVar1;
  auVar11._8_4_ = uVar1;
  auVar11._12_4_ = uVar1;
  auVar11._16_4_ = uVar1;
  auVar11._20_4_ = uVar1;
  auVar11._24_4_ = uVar1;
  auVar11._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar10 + 0x250);
  auVar16._4_4_ = uVar1;
  auVar16._0_4_ = uVar1;
  auVar16._8_4_ = uVar1;
  auVar16._12_4_ = uVar1;
  auVar16._16_4_ = uVar1;
  auVar16._20_4_ = uVar1;
  auVar16._24_4_ = uVar1;
  auVar16._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar10 + 0x1a0);
  auVar13._4_4_ = uVar1;
  auVar13._0_4_ = uVar1;
  auVar13._8_4_ = uVar1;
  auVar13._12_4_ = uVar1;
  auVar13._16_4_ = uVar1;
  auVar13._20_4_ = uVar1;
  auVar13._24_4_ = uVar1;
  auVar13._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar10 + 0x220);
  auVar14._4_4_ = uVar1;
  auVar14._0_4_ = uVar1;
  auVar14._8_4_ = uVar1;
  auVar14._12_4_ = uVar1;
  auVar14._16_4_ = uVar1;
  auVar14._20_4_ = uVar1;
  auVar14._24_4_ = uVar1;
  auVar14._28_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar10 + 0x1e0);
  auVar15._4_4_ = uVar1;
  auVar15._0_4_ = uVar1;
  auVar15._8_4_ = uVar1;
  auVar15._12_4_ = uVar1;
  auVar15._16_4_ = uVar1;
  auVar15._20_4_ = uVar1;
  auVar15._24_4_ = uVar1;
  auVar15._28_4_ = uVar1;
  iVar9 = 1 << ((char)bit - 1U & 0x1f);
  auVar19._4_4_ = iVar9;
  auVar19._0_4_ = iVar9;
  auVar19._8_4_ = iVar9;
  auVar19._12_4_ = iVar9;
  auVar19._16_4_ = iVar9;
  auVar19._20_4_ = iVar9;
  auVar19._24_4_ = iVar9;
  auVar19._28_4_ = iVar9;
  auVar16 = vpmulld_avx2((undefined1  [32])*in,auVar16);
  auVar16 = vpaddd_avx2(auVar19,auVar16);
  alVar3 = (__m256i)vpsrad_avx2(auVar16,ZEXT416((uint)bit));
  auVar16 = vpmulld_avx2((undefined1  [32])*in,auVar11);
  auVar16 = vpsubd_avx2(auVar19,auVar16);
  auVar4 = vpsrad_avx2(auVar16,ZEXT416((uint)bit));
  auVar16 = vpmulld_avx2((undefined1  [32])alVar3,auVar13);
  auVar11 = vpmulld_avx2(auVar4,auVar14);
  auVar16 = vpaddd_avx2(auVar19,auVar16);
  auVar16 = vpaddd_avx2(auVar16,auVar11);
  auVar17 = ZEXT416((uint)bit);
  auVar5 = vpsrad_avx2(auVar16,auVar17);
  auVar16 = vpmulld_avx2((undefined1  [32])alVar3,auVar14);
  auVar11 = vpmulld_avx2(auVar13,auVar4);
  auVar16 = vpaddd_avx2(auVar19,auVar16);
  auVar16 = vpsubd_avx2(auVar16,auVar11);
  alVar12 = (__m256i)vpsrad_avx2(auVar16,auVar17);
  auVar16 = vpmulld_avx2((undefined1  [32])alVar3,auVar15);
  auVar13 = vpmulld_avx2(auVar4,auVar15);
  auVar16 = vpaddd_avx2(auVar19,auVar16);
  auVar11 = vpaddd_avx2(auVar13,auVar16);
  auVar14 = vpsrad_avx2(auVar11,auVar17);
  auVar16 = vpsubd_avx2(auVar16,auVar13);
  alVar6 = (__m256i)vpsrad_avx2(auVar16,auVar17);
  auVar16 = vpmulld_avx2(auVar5,auVar15);
  auVar13 = vpmulld_avx2((undefined1  [32])alVar12,auVar15);
  auVar16 = vpaddd_avx2(auVar16,auVar19);
  auVar11 = vpaddd_avx2(auVar16,auVar13);
  alVar7 = (__m256i)vpsrad_avx2(auVar11,ZEXT416((uint)bit));
  auVar16 = vpsubd_avx2(auVar16,auVar13);
  auVar16 = vpsrad_avx2(auVar16,ZEXT416((uint)bit));
  if (do_cols == 0) {
    iVar9 = 10;
    if (10 < bd) {
      iVar9 = bd;
    }
    iVar9 = 0x20 << ((byte)iVar9 & 0x1f);
    iVar8 = -iVar9;
    auVar18._4_4_ = iVar8;
    auVar18._0_4_ = iVar8;
    auVar18._8_4_ = iVar8;
    auVar18._12_4_ = iVar8;
    auVar18._16_4_ = iVar8;
    auVar18._20_4_ = iVar8;
    auVar18._24_4_ = iVar8;
    auVar18._28_4_ = iVar8;
    iVar9 = iVar9 + -1;
    auVar20._4_4_ = iVar9;
    auVar20._0_4_ = iVar9;
    auVar20._8_4_ = iVar9;
    auVar20._12_4_ = iVar9;
    auVar20._16_4_ = iVar9;
    auVar20._20_4_ = iVar9;
    auVar20._24_4_ = iVar9;
    auVar20._28_4_ = iVar9;
    iVar9 = (1 << ((byte)out_shift & 0x1f)) >> 1;
    auVar21._4_4_ = iVar9;
    auVar21._0_4_ = iVar9;
    auVar21._8_4_ = iVar9;
    auVar21._12_4_ = iVar9;
    auVar21._16_4_ = iVar9;
    auVar21._20_4_ = iVar9;
    auVar21._24_4_ = iVar9;
    auVar21._28_4_ = iVar9;
    auVar11 = vpaddd_avx2(auVar21,(undefined1  [32])alVar3);
    auVar13 = vpsubd_avx2(auVar21,auVar5);
    auVar11 = vpsrad_avx2(auVar11,ZEXT416((uint)out_shift));
    auVar13 = vpsrad_avx2(auVar13,ZEXT416((uint)out_shift));
    auVar11 = vpmaxsd_avx2(auVar11,auVar18);
    alVar3 = (__m256i)vpminsd_avx2(auVar11,auVar20);
    auVar11 = vpmaxsd_avx2(auVar13,auVar18);
    alVar2 = (__m256i)vpminsd_avx2(auVar11,auVar20);
    *out = alVar3;
    out[1] = alVar2;
    auVar11 = vpaddd_avx2((undefined1  [32])alVar7,auVar21);
    auVar13 = vpsubd_avx2(auVar21,auVar14);
    auVar17 = ZEXT416((uint)out_shift);
    auVar11 = vpsrad_avx2(auVar11,auVar17);
    auVar13 = vpsrad_avx2(auVar13,auVar17);
    auVar11 = vpmaxsd_avx2(auVar11,auVar18);
    alVar3 = (__m256i)vpminsd_avx2(auVar11,auVar20);
    auVar11 = vpmaxsd_avx2(auVar13,auVar18);
    alVar7 = (__m256i)vpminsd_avx2(auVar11,auVar20);
    out[2] = alVar3;
    out[3] = alVar7;
    auVar11 = vpaddd_avx2(auVar21,(undefined1  [32])alVar6);
    auVar13 = vpsubd_avx2(auVar21,auVar16);
    auVar16 = vpsrad_avx2(auVar11,auVar17);
    auVar11 = vpsrad_avx2(auVar13,auVar17);
    auVar16 = vpmaxsd_avx2(auVar16,auVar18);
    alVar3 = (__m256i)vpminsd_avx2(auVar16,auVar20);
    auVar16 = vpmaxsd_avx2(auVar11,auVar18);
    alVar6 = (__m256i)vpminsd_avx2(auVar16,auVar20);
    out[4] = alVar3;
    out[5] = alVar6;
    auVar16 = vpaddd_avx2(auVar21,(undefined1  [32])alVar12);
    auVar11 = vpsubd_avx2(auVar21,auVar4);
    auVar16 = vpsrad_avx2(auVar16,ZEXT416((uint)out_shift));
    auVar11 = vpsrad_avx2(auVar11,ZEXT416((uint)out_shift));
    auVar16 = vpmaxsd_avx2(auVar16,auVar18);
    alVar3 = (__m256i)vpminsd_avx2(auVar16,auVar20);
    auVar16 = vpmaxsd_avx2(auVar11,auVar18);
    alVar12 = (__m256i)vpminsd_avx2(auVar16,auVar20);
    out[6] = alVar3;
  }
  else {
    *out = alVar3;
    auVar11 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
    alVar3 = (__m256i)vpsubd_avx2(auVar11,auVar5);
    out[1] = alVar3;
    out[2] = alVar7;
    alVar3 = (__m256i)vpsubd_avx2(auVar11,auVar14);
    out[3] = alVar3;
    out[4] = alVar6;
    alVar3 = (__m256i)vpsubd_avx2(auVar11,auVar16);
    out[5] = alVar3;
    out[6] = alVar12;
    alVar12 = (__m256i)vpsubd_avx2(auVar11,auVar4);
  }
  out[7] = alVar12;
  return;
}

Assistant:

static void iadst8x8_low1_avx2(__m256i *in, __m256i *out, int bit, int do_cols,
                               int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m256i cospi4 = _mm256_set1_epi32(cospi[4]);
  const __m256i cospi60 = _mm256_set1_epi32(cospi[60]);
  const __m256i cospi16 = _mm256_set1_epi32(cospi[16]);
  const __m256i cospi48 = _mm256_set1_epi32(cospi[48]);
  const __m256i cospi32 = _mm256_set1_epi32(cospi[32]);
  const __m256i rnding = _mm256_set1_epi32(1 << (bit - 1));
  const __m256i kZero = _mm256_setzero_si256();
  __m256i u[8], x;

  // stage 0
  // stage 1
  // stage 2

  x = _mm256_mullo_epi32(in[0], cospi60);
  u[0] = _mm256_add_epi32(x, rnding);
  u[0] = _mm256_srai_epi32(u[0], bit);

  x = _mm256_mullo_epi32(in[0], cospi4);
  u[1] = _mm256_sub_epi32(kZero, x);
  u[1] = _mm256_add_epi32(u[1], rnding);
  u[1] = _mm256_srai_epi32(u[1], bit);

  // stage 3
  // stage 4
  __m256i temp1, temp2;
  temp1 = _mm256_mullo_epi32(u[0], cospi16);
  x = _mm256_mullo_epi32(u[1], cospi48);
  temp1 = _mm256_add_epi32(temp1, x);
  temp1 = _mm256_add_epi32(temp1, rnding);
  temp1 = _mm256_srai_epi32(temp1, bit);
  u[4] = temp1;

  temp2 = _mm256_mullo_epi32(u[0], cospi48);
  x = _mm256_mullo_epi32(u[1], cospi16);
  u[5] = _mm256_sub_epi32(temp2, x);
  u[5] = _mm256_add_epi32(u[5], rnding);
  u[5] = _mm256_srai_epi32(u[5], bit);

  // stage 5
  // stage 6
  temp1 = _mm256_mullo_epi32(u[0], cospi32);
  x = _mm256_mullo_epi32(u[1], cospi32);
  u[2] = _mm256_add_epi32(temp1, x);
  u[2] = _mm256_add_epi32(u[2], rnding);
  u[2] = _mm256_srai_epi32(u[2], bit);

  u[3] = _mm256_sub_epi32(temp1, x);
  u[3] = _mm256_add_epi32(u[3], rnding);
  u[3] = _mm256_srai_epi32(u[3], bit);

  temp1 = _mm256_mullo_epi32(u[4], cospi32);
  x = _mm256_mullo_epi32(u[5], cospi32);
  u[6] = _mm256_add_epi32(temp1, x);
  u[6] = _mm256_add_epi32(u[6], rnding);
  u[6] = _mm256_srai_epi32(u[6], bit);

  u[7] = _mm256_sub_epi32(temp1, x);
  u[7] = _mm256_add_epi32(u[7], rnding);
  u[7] = _mm256_srai_epi32(u[7], bit);

  // stage 7
  if (do_cols) {
    out[0] = u[0];
    out[1] = _mm256_sub_epi32(kZero, u[4]);
    out[2] = u[6];
    out[3] = _mm256_sub_epi32(kZero, u[2]);
    out[4] = u[3];
    out[5] = _mm256_sub_epi32(kZero, u[7]);
    out[6] = u[5];
    out[7] = _mm256_sub_epi32(kZero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m256i clamp_lo_out = _mm256_set1_epi32(-(1 << (log_range_out - 1)));
    const __m256i clamp_hi_out =
        _mm256_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_avx2(u[0], u[4], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
    neg_shift_avx2(u[6], u[2], out + 2, out + 3, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
    neg_shift_avx2(u[3], u[7], out + 4, out + 5, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
    neg_shift_avx2(u[5], u[1], out + 6, out + 7, &clamp_lo_out, &clamp_hi_out,
                   out_shift);
  }
}